

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O0

QPolygonF * QStyleHelper::calcLines(QStyleOptionSlider *dial)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  reference pQVar4;
  long in_RSI;
  QList<QPointF> *in_RDI;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  qreal c;
  qreal s;
  qreal angle;
  int i;
  int smallLineSize;
  int maximum;
  int notches;
  int ns;
  qreal yc;
  qreal xc;
  int bigLineSize;
  qreal r;
  int height;
  int width;
  QPolygonF poly;
  QRect *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  qsizetype in_stack_ffffffffffffff08;
  QList<QPointF> *this;
  int local_c8;
  int local_bc;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  int local_28;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QPolygonF::QPolygonF((QPolygonF *)0x4168e0);
  local_24 = QRect::width(in_stack_fffffffffffffef8);
  local_28 = QRect::height(in_stack_fffffffffffffef8);
  piVar3 = qMin<int>(&local_24,&local_28);
  dVar5 = (double)(*piVar3 / 2);
  iVar2 = calcBigLineSize((int)dVar5);
  dVar6 = (double)(local_24 / 2) + 0.5;
  dVar7 = (double)(local_28 / 2) + 0.5;
  iVar1 = *(int *)(in_RSI + 0x58);
  if (iVar1 == 0) {
    QPolygonF::QPolygonF
              ((QPolygonF *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QPolygonF *)in_stack_fffffffffffffef8);
  }
  else {
    local_bc = ((*(int *)(in_RSI + 0x50) + iVar1 + -1) - *(int *)(in_RSI + 0x4c)) / iVar1;
    if (local_bc < 1) {
      QPolygonF::QPolygonF
                ((QPolygonF *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (QPolygonF *)in_stack_fffffffffffffef8);
    }
    else {
      if ((*(int *)(in_RSI + 0x50) < *(int *)(in_RSI + 0x4c)) ||
         (1000 < *(int *)(in_RSI + 0x50) - *(int *)(in_RSI + 0x4c))) {
        local_bc = ((*(int *)(in_RSI + 0x4c) + iVar1 + 999) - *(int *)(in_RSI + 0x4c)) / iVar1;
      }
      QList<QPointF>::resize(this,in_stack_ffffffffffffff08);
      for (local_c8 = 0; local_c8 <= local_bc; local_c8 = local_c8 + 1) {
        dVar8 = qSin<double>(2.11819578583968e-317);
        dVar9 = qCos<double>(2.11820418495566e-317);
        if (local_c8 == 0) {
LAB_00416b8f:
          QPointF::QPointF(&local_38,(dVar5 - (double)iVar2) * dVar9 + dVar6,
                           -(dVar5 - (double)iVar2) * dVar8 + dVar7);
          pQVar4 = QList<QPointF>::operator[]
                             ((QList<QPointF> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              (qsizetype)in_stack_fffffffffffffef8);
          pQVar4->xp = local_38.xp;
          pQVar4->yp = local_38.yp;
          QPointF::QPointF(&local_48,dVar5 * dVar9 + dVar6,-dVar5 * dVar8 + dVar7);
          pQVar4 = QList<QPointF>::operator[]
                             ((QList<QPointF> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              (qsizetype)in_stack_fffffffffffffef8);
          pQVar4->xp = local_48.xp;
          pQVar4->yp = local_48.yp;
        }
        else {
          in_stack_ffffffffffffff04 = iVar1 * local_c8;
          if (*(int *)(in_RSI + 0x6c) == 0) {
            in_stack_ffffffffffffff00 = 1;
          }
          else {
            in_stack_ffffffffffffff00 = *(int *)(in_RSI + 0x6c);
          }
          if (in_stack_ffffffffffffff04 % in_stack_ffffffffffffff00 == 0) goto LAB_00416b8f;
          QPointF::QPointF(&local_58,((dVar5 - 1.0) - (double)(iVar2 / 2)) * dVar9 + dVar6,
                           -((dVar5 - 1.0) - (double)(iVar2 / 2)) * dVar8 + dVar7);
          pQVar4 = QList<QPointF>::operator[]
                             ((QList<QPointF> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              (qsizetype)in_stack_fffffffffffffef8);
          pQVar4->xp = local_58.xp;
          pQVar4->yp = local_58.yp;
          QPointF::QPointF(&local_68,(dVar5 - 1.0) * dVar9 + dVar6,-(dVar5 - 1.0) * dVar8 + dVar7);
          pQVar4 = QList<QPointF>::operator[]
                             ((QList<QPointF> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              (qsizetype)in_stack_fffffffffffffef8);
          pQVar4->xp = local_68.xp;
          pQVar4->yp = local_68.yp;
        }
      }
      QRect::topLeft(in_stack_fffffffffffffef8);
      QPointF::QPointF((QPointF *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       (QPoint *)in_stack_fffffffffffffef8);
      QPolygonF::translated((QPointF *)this);
    }
  }
  QPolygonF::~QPolygonF((QPolygonF *)0x416e72);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPolygonF *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF calcLines(const QStyleOptionSlider *dial)
{
    QPolygonF poly;
    int width = dial->rect.width();
    int height = dial->rect.height();
    qreal r = qMin(width, height) / 2;
    int bigLineSize = calcBigLineSize(int(r));

    qreal xc = width / 2 + 0.5;
    qreal yc = height / 2 + 0.5;
    const int ns = dial->tickInterval;
    if (!ns) // Invalid values may be set by Qt Widgets Designer.
        return poly;
    int notches = (dial->maximum + ns - 1 - dial->minimum) / ns;
    if (notches <= 0)
        return poly;
    if (dial->maximum < dial->minimum || dial->maximum - dial->minimum > 1000) {
        int maximum = dial->minimum + 1000;
        notches = (maximum + ns - 1 - dial->minimum) / ns;
    }

    poly.resize(2 + 2 * notches);
    int smallLineSize = bigLineSize / 2;
    for (int i = 0; i <= notches; ++i) {
        qreal angle = dial->dialWrapping ? Q_PI * 3 / 2 - i * 2 * Q_PI / notches
                  : (Q_PI * 8 - i * 10 * Q_PI / notches) / 6;
        qreal s = qSin(angle);
        qreal c = qCos(angle);
        if (i == 0 || (((ns * i) % (dial->pageStep ? dial->pageStep : 1)) == 0)) {
            poly[2 * i] = QPointF(xc + (r - bigLineSize) * c,
                                  yc - (r - bigLineSize) * s);
            poly[2 * i + 1] = QPointF(xc + r * c, yc - r * s);
        } else {
            poly[2 * i] = QPointF(xc + (r - 1 - smallLineSize) * c,
                                  yc - (r - 1 - smallLineSize) * s);
            poly[2 * i + 1] = QPointF(xc + (r - 1) * c, yc -(r - 1) * s);
        }
    }
    return poly.translated(dial->rect.topLeft());
}